

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

int Abs_ManSupport3(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj_01;
  bool bVar4;
  int fChanges;
  int nSize0;
  int i;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *pTemp;
  Vec_Int_t *vSupp_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  Abs_ManSupport2(p,pObj,vSupp);
  iVar2 = Abs_GiaSortNodes(p,vSupp);
  if (iVar2 < 1) {
    __assert_fail("nSize0 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x218,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
LAB_0071adf1:
  bVar1 = false;
  fChanges = 0;
  do {
    iVar3 = Vec_IntSize(vSupp);
    bVar4 = false;
    if (fChanges < iVar3) {
      iVar3 = Vec_IntEntry(vSupp,fChanges);
      pFan0 = Gia_ManObj(p,iVar3);
      bVar4 = pFan0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) goto LAB_0071b098;
    if ((iVar2 <= fChanges) && (iVar3 = Gia_ObjIsAnd(pFan0), iVar3 != 0)) {
      if ((*(ulong *)pFan0 >> 0x3e & 1) != 0) {
        __assert_fail("!pTemp->fMark1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                      ,0x223,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      iVar3 = Gia_ObjRefNum(p,pFan0);
      if (iVar3 < 1) {
        __assert_fail("Gia_ObjRefNum(p, pTemp) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                      ,0x224,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      pObj_00 = Gia_ObjFanin0(pFan0);
      pObj_01 = Gia_ObjFanin1(pFan0);
      iVar3 = Gia_ObjIsTravIdCurrent(p,pObj_00);
      if ((iVar3 != 0) && (iVar3 = Gia_ObjIsTravIdCurrent(p,pObj_01), iVar3 != 0)) {
        iVar3 = Gia_ObjId(p,pFan0);
        Vec_IntRemove(vSupp,iVar3);
        bVar1 = true;
        goto LAB_0071b098;
      }
      iVar3 = Gia_ObjIsTravIdCurrent(p,pObj_00);
      if (iVar3 != 0) {
        iVar3 = Gia_ObjId(p,pFan0);
        Vec_IntRemove(vSupp,iVar3);
        iVar3 = Gia_ObjId(p,pObj_01);
        Vec_IntPush(vSupp,iVar3);
        iVar3 = Gia_ObjIsTravIdCurrent(p,pObj_01);
        if (iVar3 != 0) {
          __assert_fail("!Gia_ObjIsTravIdCurrent(p, pFan1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                        ,0x231,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        Gia_ObjSetTravIdCurrent(p,pObj_01);
        bVar1 = true;
        goto LAB_0071b098;
      }
      iVar3 = Gia_ObjIsTravIdCurrent(p,pObj_01);
      if (iVar3 != 0) break;
    }
    fChanges = fChanges + 1;
  } while( true );
  iVar3 = Gia_ObjId(p,pFan0);
  Vec_IntRemove(vSupp,iVar3);
  iVar3 = Gia_ObjId(p,pObj_00);
  Vec_IntPush(vSupp,iVar3);
  iVar3 = Gia_ObjIsTravIdCurrent(p,pObj_00);
  if (iVar3 != 0) {
    __assert_fail("!Gia_ObjIsTravIdCurrent(p, pFan0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x23a,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  Gia_ObjSetTravIdCurrent(p,pObj_00);
  bVar1 = true;
LAB_0071b098:
  if (!bVar1) {
    iVar2 = Vec_IntSize(vSupp);
    return iVar2;
  }
  goto LAB_0071adf1;
}

Assistant:

int Abs_ManSupport3( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pTemp, * pFan0, * pFan1;
    int i, nSize0;
    // collect MFFC
    Abs_ManSupport2( p, pObj, vSupp );
    // move dominated to the front
    nSize0 = Abs_GiaSortNodes( p, vSupp );
    assert( nSize0 > 0 );
    // consider remaining nodes
    while ( 1 )
    {
        int fChanges = 0;
        Gia_ManForEachObjVec( vSupp, p, pTemp, i )
        {
            if ( i < nSize0 )
                continue;
            if ( !Gia_ObjIsAnd(pTemp) )
                continue;
            assert( !pTemp->fMark1 );
            assert( Gia_ObjRefNum(p, pTemp) > 0 );
            pFan0 = Gia_ObjFanin0(pTemp);
            pFan1 = Gia_ObjFanin1(pTemp);
            if ( Gia_ObjIsTravIdCurrent(p, pFan0) && Gia_ObjIsTravIdCurrent(p, pFan1) )
            {
                Vec_IntRemove( vSupp, Gia_ObjId(p, pTemp) );
                fChanges = 1;
                break;
            }
            if ( Gia_ObjIsTravIdCurrent(p, pFan0) )
            {
                Vec_IntRemove( vSupp, Gia_ObjId(p, pTemp) );
                Vec_IntPush( vSupp, Gia_ObjId(p, pFan1) );
                assert( !Gia_ObjIsTravIdCurrent(p, pFan1) );
                Gia_ObjSetTravIdCurrent(p, pFan1);
                fChanges = 1;
                break;
            }
            if ( Gia_ObjIsTravIdCurrent(p, pFan1) )
            {
                Vec_IntRemove( vSupp, Gia_ObjId(p, pTemp) );
                Vec_IntPush( vSupp, Gia_ObjId(p, pFan0) );
                assert( !Gia_ObjIsTravIdCurrent(p, pFan0) );
                Gia_ObjSetTravIdCurrent(p, pFan0);
                fChanges = 1;
                break;
            }
        }
        if ( !fChanges )
            break;
    }
    return Vec_IntSize(vSupp);
}